

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CoverageBinSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CoverageBinSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1)

{
  string_view name;
  CoverageBinSymbol *pCVar1;
  CoverageBinSymbol *in_RDX;
  SourceLocation in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pCVar1 = (CoverageBinSymbol *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  name._M_str = unaff_retaddr;
  name._M_len = in_RDI;
  ast::CoverageBinSymbol::CoverageBinSymbol(in_RDX,name,in_RSI);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }